

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O1

int narrow_conv_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  double dVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  uint *puVar5;
  uint *puVar6;
  jit_State *pjVar7;
  IRIns *pIVar8;
  NarrowIns *pNVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  NarrowIns *savesp;
  double dVar18;
  
  puVar5 = nc->sp;
  puVar6 = nc->maxsp;
  if (puVar6 <= puVar5) {
    return 10;
  }
  pjVar7 = nc->J;
  pIVar8 = (pjVar7->cur).ir;
  uVar17 = (ulong)ref;
  cVar2 = *(char *)((long)pIVar8 + uVar17 * 8 + 5);
  if (cVar2 == '\x1c') {
    dVar1 = *(double *)&pIVar8[uVar17 + 1].i;
    if ((nc->mode & 0xf000) == 0) {
      dVar18 = (double)(long)dVar1;
      if (dVar1 != dVar18) {
        return 10;
      }
      if (NAN(dVar1) || NAN(dVar18)) {
        return 10;
      }
      nc->sp = puVar5 + 1;
      *puVar5 = 0x30000;
      nc->sp = puVar5 + 2;
      puVar5[1] = (uint)(long)dVar1;
    }
    else {
      uVar14 = (uint)dVar1;
      if ((int)(short)uVar14 != uVar14) {
        return 10;
      }
      if (dVar1 != (double)(int)dVar1) {
        return 10;
      }
      if (NAN(dVar1) || NAN((double)(int)dVar1)) {
        return 10;
      }
      nc->sp = puVar5 + 1;
      *puVar5 = 0x30000;
      nc->sp = puVar5 + 2;
      puVar5[1] = uVar14;
    }
  }
  else {
    if ((cVar2 == '[') && ((*(ushort *)((long)pIVar8 + uVar17 * 8 + 2) & 0x1f) == 0x13)) {
      uVar4 = pIVar8[uVar17].field_0.op1;
      if ((nc->mode & 0xf000) < 0x1001) {
        narrow_stripov_backprop(nc,(uint)uVar4,depth + 1);
      }
      else {
        nc->sp = puVar5 + 1;
        *puVar5 = (uint)uVar4;
      }
      if (nc->t != IRT_I64) {
        return 0;
      }
      pNVar9 = nc->sp;
      nc->sp = pNVar9 + 1;
      *pNVar9 = 0x20000;
      return 0;
    }
    uVar14 = (uint)pjVar7->chain[(pjVar7->fold).ins.field_1.o];
    do {
      if (uVar14 <= ref) {
        if (1 < (byte)(*(char *)((long)pIVar8 + uVar17 * 8 + 5) - 0x29U)) goto LAB_0015ae35;
        uVar14 = nc->mode;
        uVar15 = (ulong)uVar14;
        uVar13 = (ulong)(uVar14 | 0x1000);
        if ((uVar14 & 0xf000) != 0x2000) {
          uVar13 = uVar15;
        }
        if (depth < 1) {
          uVar13 = (ulong)uVar14;
        }
        lVar16 = 0;
        goto LAB_0015ad83;
      }
      uVar15 = (ulong)uVar14;
      if ((pIVar8[uVar15].field_0.op1 == ref) &&
         (((pjVar7->fold).ins.field_1.o == '\\' ||
          (((nc->mode & 0xfff) == (*(ushort *)((long)pIVar8 + uVar15 * 8 + 2) & 0xfff) &&
           (((pjVar7->fold).ins.field_1.t.irt & 0x80) <=
            (*(byte *)((long)pIVar8 + uVar15 * 8 + 4) & 0x80))))))) {
        puVar5 = nc->sp;
        nc->sp = puVar5 + 1;
        *puVar5 = uVar14;
        bVar10 = false;
      }
      else {
        uVar14 = (uint)*(ushort *)((long)pIVar8 + uVar15 * 8 + 6);
        bVar10 = true;
      }
    } while (bVar10);
  }
  return 0;
  while (lVar16 = lVar16 + 8, lVar16 != 0x80) {
LAB_0015ad83:
    if (*(short *)((long)&pjVar7->bpropcache[0].key + lVar16) == (short)ref) {
      uVar14 = *(uint *)((long)&pjVar7->bpropcache[0].mode + lVar16);
      if ((uVar14 < (uint)uVar13) || (((uVar14 ^ (uint)uVar13) & 0xfff) != 0)) goto LAB_0015ad9f;
      uVar15 = (long)&pjVar7->bpropcache[0].key + lVar16;
      bVar10 = false;
    }
    else {
LAB_0015ad9f:
      bVar10 = true;
    }
    if (!bVar10) goto LAB_0015ae16;
  }
  uVar15 = 0;
LAB_0015ae16:
  if (uVar15 == 0) {
    if (nc->t == IRT_I64) {
      lVar16 = 0;
      do {
        if ((*(short *)((long)&pjVar7->bpropcache[0].key + lVar16) == (short)ref) &&
           (uVar14 = *(uint *)((long)&pjVar7->bpropcache[0].mode + lVar16),
           0x226d < uVar14 && (uVar14 & 0xfff) == 0x26e)) {
          uVar13 = (long)&pjVar7->bpropcache[0].key + lVar16;
          bVar10 = false;
        }
        else {
          bVar10 = true;
        }
        if (!bVar10) goto LAB_0015aead;
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0x80);
      uVar13 = 0;
LAB_0015aead:
      if (uVar13 != 0) {
        uVar4 = *(ushort *)(uVar13 + 2);
        puVar5 = nc->sp;
        nc->sp = puVar5 + 1;
        *puVar5 = (uint)uVar4;
        nc->sp = puVar5 + 2;
        puVar5[1] = 0x20000;
        goto LAB_0015ae2d;
      }
    }
    bVar10 = true;
    iVar12 = 0;
    if ((0x62 < depth) || (puVar5 = nc->sp, iVar12 = 0, puVar6 <= puVar5)) goto LAB_0015ae31;
    iVar11 = narrow_conv_backprop(nc,(uint)pIVar8[uVar17].field_0.op1,depth + 1);
    iVar12 = narrow_conv_backprop(nc,(uint)*(ushort *)((long)pIVar8 + uVar17 * 8 + 2),depth + 1);
    iVar12 = iVar12 + iVar11;
    bVar10 = 1 < iVar12;
    if (iVar12 < 2) {
      bVar3 = *(byte *)((long)pIVar8 + uVar17 * 8 + 5);
      pNVar9 = nc->sp;
      nc->sp = pNVar9 + 1;
      *pNVar9 = (nc->t << 0x10 | (uint)bVar3 << 0x18) + ref;
      goto LAB_0015ae31;
    }
    nc->sp = puVar5;
  }
  else {
    uVar4 = *(ushort *)(uVar15 + 2);
    puVar5 = nc->sp;
    nc->sp = puVar5 + 1;
    *puVar5 = (uint)uVar4;
LAB_0015ae2d:
    bVar10 = false;
  }
  iVar12 = 0;
LAB_0015ae31:
  if (bVar10) {
LAB_0015ae35:
    pNVar9 = nc->sp;
    nc->sp = pNVar9 + 1;
    *pNVar9 = ref + 0x10000;
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

static int narrow_conv_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  IRRef cref;

  if (nc->sp >= nc->maxsp) return 10;  /* Path too deep. */

  /* Check the easy cases first. */
  if (ir->o == IR_CONV && (ir->op2 & IRCONV_SRCMASK) == IRT_INT) {
    if ((nc->mode & IRCONV_CONVMASK) <= IRCONV_ANY)
      narrow_stripov_backprop(nc, ir->op1, depth+1);
    else
      *nc->sp++ = NARROWINS(NARROW_REF, ir->op1);  /* Undo conversion. */
    if (nc->t == IRT_I64)
      *nc->sp++ = NARROWINS(NARROW_SEXT, 0);  /* Sign-extend integer. */
    return 0;
  } else if (ir->o == IR_KNUM) {  /* Narrow FP constant. */
    lua_Number n = ir_knum(ir)->n;
    if ((nc->mode & IRCONV_CONVMASK) == IRCONV_TOBIT) {
      /* Allows a wider range of constants. */
      int64_t k64 = (int64_t)n;
      if (n == (lua_Number)k64) {  /* Only if const doesn't lose precision. */
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k64;  /* But always truncate to 32 bits. */
	return 0;
      }
    } else {
      int32_t k = lj_num2int(n);
      /* Only if constant is a small integer. */
      if (checki16(k) && n == (lua_Number)k) {
	*nc->sp++ = NARROWINS(NARROW_INT, 0);
	*nc->sp++ = (NarrowIns)k;
	return 0;
      }
    }
    return 10;  /* Never narrow other FP constants (this is rare). */
  }

  /* Try to CSE the conversion. Stronger checks are ok, too. */
  cref = J->chain[fins->o];
  while (cref > ref) {
    IRIns *cr = IR(cref);
    if (cr->op1 == ref &&
	(fins->o == IR_TOBIT ||
	 ((cr->op2 & IRCONV_MODEMASK) == (nc->mode & IRCONV_MODEMASK) &&
	  irt_isguard(cr->t) >= irt_isguard(fins->t)))) {
      *nc->sp++ = NARROWINS(NARROW_REF, cref);
      return 0;  /* Already there, no additional conversion needed. */
    }
    cref = cr->prev;
  }

  /* Backpropagate across ADD/SUB. */
  if (ir->o == IR_ADD || ir->o == IR_SUB) {
    /* Try cache lookup first. */
    IRRef mode = nc->mode;
    BPropEntry *bp;
    /* Inner conversions need a stronger check. */
    if ((mode & IRCONV_CONVMASK) == IRCONV_INDEX && depth > 0)
      mode += IRCONV_CHECK-IRCONV_INDEX;
    bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
    if (bp) {
      *nc->sp++ = NARROWINS(NARROW_REF, bp->val);
      return 0;
    } else if (nc->t == IRT_I64) {
      /* Try sign-extending from an existing (checked) conversion to int. */
      mode = (IRT_INT<<5)|IRT_NUM|IRCONV_INDEX;
      bp = narrow_bpc_get(nc->J, (IRRef1)ref, mode);
      if (bp) {
	*nc->sp++ = NARROWINS(NARROW_REF, bp->val);
	*nc->sp++ = NARROWINS(NARROW_SEXT, 0);
	return 0;
      }
    }
    if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      int count = narrow_conv_backprop(nc, ir->op1, depth);
      count += narrow_conv_backprop(nc, ir->op2, depth);
      if (count <= 1) {  /* Limit total number of conversions. */
	*nc->sp++ = NARROWINS(IRT(ir->o, nc->t), ref);
	return count;
      }
      nc->sp = savesp;  /* Too many conversions, need to backtrack. */
    }
  }

  /* Otherwise add a conversion. */
  *nc->sp++ = NARROWINS(NARROW_CONV, ref);
  return 1;
}